

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

ostream * om::net::operator<<(ostream *os_,mac_addr *a_)

{
  ostream *poVar1;
  string local_38;
  mac_addr *local_18;
  mac_addr *a__local;
  ostream *os__local;
  
  local_18 = a_;
  a__local = (mac_addr *)os_;
  mac_addr::to_string_abi_cxx11_(&local_38,a_);
  poVar1 = std::operator<<(os_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os_, mac_addr& a_)
			{
				return (os_ << a_.to_string());
			}